

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

String * __thiscall kj::_::Event::traceEvent(String *__return_storage_ptr__,Event *this)

{
  TraceBuilder *params;
  ArrayPtr<void_*> local_140;
  undefined1 local_130 [8];
  TraceBuilder builder;
  void *space [32];
  Event *this_local;
  
  memset(&builder.limit,0,0x100);
  ArrayPtr<void*>::ArrayPtr<32ul>((ArrayPtr<void*> *)&local_140,(void *(*) [32])&builder.limit);
  TraceBuilder::TraceBuilder((TraceBuilder *)local_130,local_140);
  (**this->_vptr_Event)(this,local_130);
  str<kj::_::TraceBuilder&>(__return_storage_ptr__,(kj *)local_130,params);
  return __return_storage_ptr__;
}

Assistant:

String Event::traceEvent() {
  void* space[32]{};
  TraceBuilder builder(space);
  traceEvent(builder);
  return kj::str(builder);
}